

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_adj.cpp
# Opt level: O2

void Omega_h::sort_by_high_index(LOs *l2lh,Write<int> *lh2h,Write<signed_char> *codes)

{
  undefined1 uVar1;
  int iVar2;
  int iVar3;
  Alloc *pAVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  int c;
  LO k;
  ulong uVar9;
  long lVar10;
  int iVar11;
  size_t sVar12;
  ScopedTimer omega_h_scoped_function_timer;
  ScopedTimer omega_h_scoped_function_timer_1;
  allocator local_e9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  Write<signed_char> local_c8;
  string local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  type f;
  string local_48;
  
  std::__cxx11::string::string
            ((string *)&local_98,
             "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_adj.cpp"
             ,(allocator *)&local_48);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&f,&local_98,
                 ":");
  std::__cxx11::to_string(&local_b8,0xb4);
  std::operator+(&local_e8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&f,
                 &local_b8);
  begin_code("sort_by_high_index",local_e8._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::~string((string *)&f);
  std::__cxx11::string::~string((string *)&local_98);
  pAVar4 = (l2lh->write_).shared_alloc_.alloc;
  if (((ulong)pAVar4 & 1) == 0) {
    sVar12 = pAVar4->size;
  }
  else {
    sVar12 = (ulong)pAVar4 >> 3;
  }
  Write<int>::Write((Write<int> *)&f,&l2lh->write_);
  Write<int>::Write(&f.lh2h,lh2h);
  Write<signed_char>::Write(&f.codes,codes);
  std::__cxx11::string::string
            ((string *)&local_b8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_for.hpp"
             ,&local_e9);
  std::operator+(&local_98,&local_b8,":");
  std::__cxx11::to_string(&local_48,0x54);
  std::operator+(&local_e8,&local_98,&local_48);
  begin_code("parallel_for",local_e8._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_b8);
  if (1 < (int)(sVar12 >> 2)) {
    entering_parallel = 1;
    Write<int>::Write((Write<int> *)&local_e8,(Write<int> *)&f);
    Write<int>::Write((Write<int> *)&local_e8.field_2,&f.lh2h);
    Write<signed_char>::Write(&local_c8,&f.codes);
    entering_parallel = 0;
    for (uVar5 = 0; uVar5 != ((sVar12 >> 2) + 0xffffffff & 0xffffffff); uVar5 = uVar5 + 1) {
      lVar6 = (long)*(int *)(local_e8._M_string_length + uVar5 * 4 + 4);
      uVar8 = (long)*(int *)(local_e8._M_string_length + uVar5 * 4);
      while ((long)uVar8 < lVar6) {
        iVar2 = *(int *)(local_e8.field_2._8_8_ + uVar8 * 4);
        uVar7 = uVar8 & 0xffffffff;
        iVar11 = iVar2;
        for (uVar9 = (ulong)(int)(uVar8 + 1); (long)uVar9 < lVar6; uVar9 = uVar9 + 1) {
          iVar3 = *(int *)(local_e8.field_2._8_8_ + uVar9 * 4);
          if (iVar3 < iVar11) {
            uVar7 = uVar9 & 0xffffffff;
          }
          if (iVar3 <= iVar11) {
            iVar11 = iVar3;
          }
        }
        lVar10 = (long)(int)uVar7;
        *(undefined4 *)(local_e8.field_2._8_8_ + uVar8 * 4) =
             *(undefined4 *)(local_e8.field_2._8_8_ + lVar10 * 4);
        *(int *)(local_e8.field_2._8_8_ + lVar10 * 4) = iVar2;
        uVar1 = *(undefined1 *)((long)local_c8.shared_alloc_.direct_ptr + uVar8);
        *(undefined1 *)((long)local_c8.shared_alloc_.direct_ptr + uVar8) =
             *(undefined1 *)((long)local_c8.shared_alloc_.direct_ptr + lVar10);
        *(undefined1 *)((long)local_c8.shared_alloc_.direct_ptr + lVar10) = uVar1;
        uVar8 = uVar8 + 1;
      }
    }
    sort_by_high_index(Omega_h::Read<int>,Omega_h::Write<int>,Omega_h::Write<signed_char>)::$_0::
    ~__0((__0 *)&local_e8);
  }
  ScopedTimer::~ScopedTimer(&omega_h_scoped_function_timer_1);
  sort_by_high_index(Omega_h::Read<int>,Omega_h::Write<int>,Omega_h::Write<signed_char>)::$_0::~__0
            ((__0 *)&f);
  ScopedTimer::~ScopedTimer(&omega_h_scoped_function_timer);
  return;
}

Assistant:

void sort_by_high_index(
    LOs const l2lh, Write<LO> const lh2h, Write<I8> const codes) {
  OMEGA_H_TIME_FUNCTION;
  LO const nl = l2lh.size() - 1;
  auto f = OMEGA_H_LAMBDA(LO const l) {
    LO const begin = l2lh[l];
    LO const end = l2lh[l + 1];
    for (LO j = begin; j < end; ++j) {
      LO k_min = j;
      GO min_h = lh2h[j];
      for (LO k = j + 1; k < end; ++k) {
        GO const h = lh2h[k];
        if (h < min_h) {
          k_min = k;
          min_h = h;
        }
      }
      swap2(lh2h[j], lh2h[k_min]);
      swap2(codes[j], codes[k_min]);
    }
  };
  parallel_for(nl, std::move(f));
}